

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_matrix_sparse.cpp
# Opt level: O0

void __thiscall
test_matrix_sparse_operator_assignment_Test::TestBody
          (test_matrix_sparse_operator_assignment_Test *this)

{
  double lhs_value;
  initializer_list<double> value;
  initializer_list<unsigned_long> index;
  initializer_list<unsigned_long> non_zero;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  uVar1;
  bool bVar2;
  char *pcVar3;
  size_t sVar4;
  __uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
  _Var5;
  Scalar *pSVar6;
  AssertHelper local_258;
  Message local_250;
  undefined1 local_248 [16];
  undefined1 local_238 [16];
  undefined1 local_228 [8];
  AssertionResult gtest_ar_2;
  size_t i_column;
  size_t i_row;
  Message local_200;
  pair<unsigned_long,_unsigned_long> local_1f8;
  pair<unsigned_long,_unsigned_long> local_1e8;
  undefined1 local_1d8 [8];
  AssertionResult gtest_ar_1;
  Message local_1c0;
  size_t local_1b8;
  size_t local_1b0;
  undefined1 local_1a8 [8];
  AssertionResult gtest_ar;
  undefined1 local_188 [8];
  Matrix_Sparse matrix_1;
  unsigned_long local_e8 [8];
  iterator local_a8;
  undefined8 local_a0;
  unsigned_long local_98 [5];
  iterator local_70;
  undefined8 local_68;
  undefined1 local_60 [8];
  Matrix_Sparse matrix_0;
  test_matrix_sparse_operator_assignment_Test *this_local;
  
  local_98[2] = 5;
  local_98[3] = 5;
  local_98[0] = 0;
  local_98[1] = 2;
  local_98[4] = 7;
  local_70 = local_98;
  local_68 = 5;
  local_e8[4] = 3;
  local_e8[5] = 4;
  local_e8[2] = 2;
  local_e8[3] = 0;
  local_e8[0] = 1;
  local_e8[1] = 3;
  local_e8[6] = 3;
  local_a8 = local_e8;
  local_a0 = 7;
  matrix_1.column_size = 0x3ff0000000000000;
  non_zero._M_len = 5;
  non_zero._M_array = local_70;
  index._M_len = 7;
  index._M_array = local_a8;
  value._M_len = 7;
  value._M_array = (iterator)&matrix_1.column_size;
  matrix_0.column_size = (size_t)this;
  Disa::Matrix_Sparse::Matrix_Sparse((Matrix_Sparse *)local_60,non_zero,index,value,5);
  Disa::Matrix_Sparse::Matrix_Sparse((Matrix_Sparse *)local_188);
  Disa::Matrix_Sparse::operator=((Matrix_Sparse *)local_188,(Matrix_Sparse *)local_60);
  local_1b0 = Disa::Matrix_Sparse::size_non_zero((Matrix_Sparse *)local_60);
  local_1b8 = Disa::Matrix_Sparse::size_non_zero((Matrix_Sparse *)local_188);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((EqHelper *)local_1a8,"matrix_0.size_non_zero()","matrix_1.size_non_zero()",&local_1b0,
             &local_1b8);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a8);
  if (!bVar2) {
    testing::Message::Message(&local_1c0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x43,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_1c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_1c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a8);
  local_1e8 = Disa::Matrix_Sparse::size((Matrix_Sparse *)local_60);
  local_1f8 = Disa::Matrix_Sparse::size((Matrix_Sparse *)local_188);
  testing::internal::EqHelper::
  Compare<std::pair<unsigned_long,_unsigned_long>,_std::pair<unsigned_long,_unsigned_long>,_nullptr>
            ((EqHelper *)local_1d8,"matrix_0.size()","matrix_1.size()",&local_1e8,&local_1f8);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d8);
  if (!bVar2) {
    testing::Message::Message(&local_200);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&i_row,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x44,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&i_row,&local_200);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&i_row);
    testing::Message::~Message(&local_200);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d8);
  for (i_column = 0; sVar4 = Disa::Matrix_Sparse::size_row((Matrix_Sparse *)local_60),
      i_column < sVar4; i_column = i_column + 1) {
    for (gtest_ar_2.message_._M_t.
         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         ._M_head_impl =
              (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
               )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )0x0;
        uVar1._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             gtest_ar_2.message_._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl,
        _Var5.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )Disa::Matrix_Sparse::size_column((Matrix_Sparse *)local_60),
        (ulong)uVar1._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl <
        (ulong)_Var5.
               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl;
        gtest_ar_2.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )((long)gtest_ar_2.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl + 1)) {
      Disa::Matrix_Sparse::operator[]((Matrix_Sparse *)local_238,(size_t *)local_60);
      pSVar6 = Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator[]<Disa::Matrix_Sparse,_true>
                         ((Matrix_Sparse_Row<Disa::Matrix_Sparse> *)local_238,
                          (size_t *)&gtest_ar_2.message_);
      lhs_value = *pSVar6;
      Disa::Matrix_Sparse::operator[]((Matrix_Sparse *)local_248,(size_t *)local_188);
      pSVar6 = Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator[]<Disa::Matrix_Sparse,_true>
                         ((Matrix_Sparse_Row<Disa::Matrix_Sparse> *)local_248,
                          (size_t *)&gtest_ar_2.message_);
      testing::internal::CmpHelperFloatingPointEQ<double>
                ((internal *)local_228,"matrix_0[i_row][i_column]","matrix_1[i_row][i_column]",
                 lhs_value,*pSVar6);
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_228);
      if (!bVar2) {
        testing::Message::Message(&local_250);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_228);
        testing::internal::AssertHelper::AssertHelper
                  (&local_258,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
                   ,0x47,pcVar3);
        testing::internal::AssertHelper::operator=(&local_258,&local_250);
        testing::internal::AssertHelper::~AssertHelper(&local_258);
        testing::Message::~Message(&local_250);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_228);
    }
  }
  Disa::Matrix_Sparse::~Matrix_Sparse((Matrix_Sparse *)local_188);
  Disa::Matrix_Sparse::~Matrix_Sparse((Matrix_Sparse *)local_60);
  return;
}

Assistant:

TEST(test_matrix_sparse, operator_assignment) {
  Matrix_Sparse matrix_0({0, 2, 5, 5, 7}, {1, 3, 2, 0, 3, 4, 3}, {1.0, 2.0, 3.0, 4.0, 5.0, 6.0, 7.0}, 5);
  Matrix_Sparse matrix_1;
  matrix_1 = matrix_0;

  EXPECT_EQ(matrix_0.size_non_zero(), matrix_1.size_non_zero());
  EXPECT_EQ(matrix_0.size(), matrix_1.size());
  FOR(i_row, matrix_0.size_row())
  FOR(i_column, matrix_0.size_column()) {
    EXPECT_DOUBLE_EQ(matrix_0[i_row][i_column], matrix_1[i_row][i_column]);
  }
}